

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::RuleBasedCollator::setVariableTop
          (RuleBasedCollator *this,UChar *varTop,int32_t len,UErrorCode *errorCode)

{
  UBool UVar1;
  UBool UVar2;
  undefined1 local_408 [8];
  FCDUTF16CollationIterator ci_1;
  undefined1 local_1e8 [8];
  UTF16CollationIterator ci;
  int64_t ce2;
  int64_t ce1;
  UBool numeric;
  UErrorCode *errorCode_local;
  int32_t len_local;
  UChar *varTop_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if ((varTop == (UChar *)0x0) && (len != 0)) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = 0;
    }
    else {
      errorCode_local._4_4_ = len;
      if (len < 0) {
        errorCode_local._4_4_ = u_strlen_63(varTop);
      }
      if (errorCode_local._4_4_ == 0) {
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        this_local._4_4_ = 0;
      }
      else {
        UVar1 = CollationSettings::isNumeric(this->settings);
        UVar2 = CollationSettings::dontCheckFCD(this->settings);
        if (UVar2 == '\0') {
          FCDUTF16CollationIterator::FCDUTF16CollationIterator
                    ((FCDUTF16CollationIterator *)local_408,this->data,UVar1,varTop,varTop,
                     varTop + errorCode_local._4_4_);
          ce2 = CollationIterator::nextCE((CollationIterator *)local_408,errorCode);
          ci.limit = (UChar *)CollationIterator::nextCE((CollationIterator *)local_408,errorCode);
          FCDUTF16CollationIterator::~FCDUTF16CollationIterator
                    ((FCDUTF16CollationIterator *)local_408);
        }
        else {
          UTF16CollationIterator::UTF16CollationIterator
                    ((UTF16CollationIterator *)local_1e8,this->data,UVar1,varTop,varTop,
                     varTop + errorCode_local._4_4_);
          ce2 = CollationIterator::nextCE((CollationIterator *)local_1e8,errorCode);
          ci.limit = (UChar *)CollationIterator::nextCE((CollationIterator *)local_1e8,errorCode);
          UTF16CollationIterator::~UTF16CollationIterator((UTF16CollationIterator *)local_1e8);
        }
        if ((ce2 == 0x101000100) || (ci.limit != (UChar *)0x101000100)) {
          *errorCode = U_CE_NOT_FOUND_ERROR;
          this_local._4_4_ = 0;
        }
        else {
          (*(this->super_Collator).super_UObject._vptr_UObject[0x1d])
                    (this,ce2 >> 0x20 & 0xffffffff,errorCode);
          this_local._4_4_ = this->settings->variableTop;
        }
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
RuleBasedCollator::setVariableTop(const UChar *varTop, int32_t len, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    if(varTop == NULL && len !=0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(len < 0) { len = u_strlen(varTop); }
    if(len == 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    UBool numeric = settings->isNumeric();
    int64_t ce1, ce2;
    if(settings->dontCheckFCD()) {
        UTF16CollationIterator ci(data, numeric, varTop, varTop, varTop + len);
        ce1 = ci.nextCE(errorCode);
        ce2 = ci.nextCE(errorCode);
    } else {
        FCDUTF16CollationIterator ci(data, numeric, varTop, varTop, varTop + len);
        ce1 = ci.nextCE(errorCode);
        ce2 = ci.nextCE(errorCode);
    }
    if(ce1 == Collation::NO_CE || ce2 != Collation::NO_CE) {
        errorCode = U_CE_NOT_FOUND_ERROR;
        return 0;
    }
    setVariableTop((uint32_t)(ce1 >> 32), errorCode);
    return settings->variableTop;
}